

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O0

int __thiscall io_buf::open_file(io_buf *this,char *name,bool stdin_off,int flag)

{
  ostream *poVar1;
  int *piVar2;
  char *pcVar3;
  undefined8 uVar4;
  int in_ECX;
  byte in_DL;
  char *in_RSI;
  string *in_RDI;
  char __errmsg [256];
  stringstream __msg;
  int ret;
  int *in_stack_fffffffffffffcf8;
  v_array<int> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd24;
  int plineNumber;
  char *in_stack_fffffffffffffd28;
  vw_exception *in_stack_fffffffffffffd30;
  char local_2b8 [272];
  stringstream local_1a8 [16];
  ostream local_198;
  int local_1c;
  byte local_11;
  char *local_10;
  
  local_11 = in_DL & 1;
  local_1c = -1;
  local_10 = in_RSI;
  if (in_ECX == 1) {
    if (*in_RSI == '\0') {
      if (local_11 == 0) {
        local_1c = fileno(_stdin);
      }
    }
    else {
      local_1c = open64(in_RSI,0);
    }
    if (local_1c != -1) {
      v_array<int>::push_back(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    }
  }
  else if (in_ECX == 2) {
    local_1c = open64(in_RSI,0x241,0x1b6);
    if (local_1c != -1) {
      v_array<int>::push_back(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Unknown file operation. Something other than READ/WRITE specified");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_1c = -1;
  }
  if ((local_1c == -1) && (*local_10 != '\0')) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar1 = std::operator<<(&local_198,"can\'t open: ");
    std::operator<<(poVar1,local_10);
    piVar2 = __errno_location();
    pcVar3 = strerror_r(*piVar2,local_2b8,0x100);
    if (pcVar3 == (char *)0x0) {
      poVar1 = std::operator<<(&local_198,"errno = ");
      std::operator<<(poVar1,local_2b8);
    }
    else {
      std::operator<<(&local_198,"errno = unknown");
    }
    plineNumber = CONCAT13(1,(int3)in_stack_fffffffffffffd24);
    uVar4 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,plineNumber,in_RDI);
    __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  return local_1c;
}

Assistant:

virtual int open_file(const char* name, bool stdin_off, int flag = READ)
  {
    int ret = -1;
    switch (flag)
    {
      case READ:
        if (*name != '\0')
        {
#ifdef _WIN32
          // _O_SEQUENTIAL hints to OS that we'll be reading sequentially, so cache aggressively.
          _sopen_s(&ret, name, _O_RDONLY | _O_BINARY | _O_SEQUENTIAL, _SH_DENYWR, 0);
#else
          ret = open(name, O_RDONLY | O_LARGEFILE);
#endif
        }
        else if (!stdin_off)
#ifdef _WIN32
          ret = _fileno(stdin);
#else
          ret = fileno(stdin);
#endif
        if (ret != -1)
          files.push_back(ret);
        break;

      case WRITE:
#ifdef _WIN32
        _sopen_s(&ret, name, _O_CREAT | _O_WRONLY | _O_BINARY | _O_TRUNC, _SH_DENYWR, _S_IREAD | _S_IWRITE);
#else
        ret = open(name, O_CREAT | O_WRONLY | O_LARGEFILE | O_TRUNC, 0666);
#endif
        if (ret != -1)
          files.push_back(ret);
        break;

      default:
        std::cerr << "Unknown file operation. Something other than READ/WRITE specified" << std::endl;
        ret = -1;
    }
    if (ret == -1 && *name != '\0')
      THROWERRNO("can't open: " << name);
    return ret;
  }